

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O1

op_t * target_gen_post_call_res_code
                 (op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,type *ret_type,op_t res,
                 MIR_insn_t_conflict call,size_t call_ops_start)

{
  MIR_type_t type;
  MIR_context_t ctx;
  gen_ctx_conflict *pgVar1;
  VARR_MIR_op_t *pVVar2;
  uint uVar3;
  MIR_insn_t_conflict insn;
  MIR_insn_code_t code;
  undefined8 disp;
  ulong uVar4;
  MIR_type_t qword_types [2];
  MIR_type_t local_70 [2];
  MIR_op_t local_68;
  
  ctx = c2m_ctx->ctx;
  pgVar1 = c2m_ctx->gen_ctx;
  if ((ret_type->mode != TM_BASIC) || ((ret_type->u).basic_type != TP_VOID)) {
    uVar3 = process_ret_type(c2m_ctx,ret_type,local_70);
    if (uVar3 != 0) {
      if (res.mir_op._8_1_ != '\n') {
LAB_001ab827:
        __assert_fail("res.mir_op.mode == MIR_OP_MEM",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                      ,0x100,
                      "op_t target_gen_post_call_res_code(c2m_ctx_t, struct type *, op_t, MIR_insn_t, size_t)"
                     );
      }
      if (0 < (int)uVar3) {
        uVar4 = 0;
        disp = res.mir_op.u.mem.disp;
        do {
          type = local_70[uVar4];
          if (type == MIR_T_F) {
            code = MIR_FMOV;
          }
          else if (type == MIR_T_D) {
            code = MIR_DMOV;
          }
          else {
            code = (uint)(type == MIR_T_LD) * 3;
          }
          MIR_new_mem_op(&local_68,ctx,type,disp,res.mir_op.u.mem.base,res.mir_op.u.mem.index,
                         res.mir_op.u.mem.scale);
          pVVar2 = pgVar1->call_ops;
          if (((pVVar2 == (VARR_MIR_op_t *)0x0) || (pVVar2->varr == (MIR_op_t *)0x0)) ||
             (pVVar2->els_num <= (long)call->ops + (uVar4 - 0x1e))) {
            target_gen_post_call_res_code_cold_1();
            goto LAB_001ab827;
          }
          insn = MIR_new_insn(ctx,code);
          MIR_append_insn(ctx,pgVar1->curr_func,insn);
          uVar4 = uVar4 + 1;
          disp = disp + 8;
        } while (uVar3 != uVar4);
      }
    }
  }
  __return_storage_ptr__->decl = res.decl;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = res._8_8_;
  (__return_storage_ptr__->mir_op).data = res.mir_op.data;
  *(long *)&(__return_storage_ptr__->mir_op).field_0x8 = res.mir_op._8_8_;
  (__return_storage_ptr__->mir_op).u.i = res.mir_op.u._0_8_;
  (__return_storage_ptr__->mir_op).u.str.s = res.mir_op.u.str.s;
  *(long *)((long)&(__return_storage_ptr__->mir_op).u + 0x10) = res.mir_op.u._16_8_;
  (__return_storage_ptr__->mir_op).u.mem.disp = res.mir_op.u.mem.disp;
  return __return_storage_ptr__;
}

Assistant:

static op_t target_gen_post_call_res_code (c2m_ctx_t c2m_ctx, struct type *ret_type, op_t res,
                                           MIR_insn_t call MIR_UNUSED, size_t call_ops_start) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_type_t type;
  MIR_insn_t insn;
  MIR_type_t qword_types[MAX_QWORDS];
  int i, n_qwords;

  if (void_type_p (ret_type)) return res;
  n_qwords = process_ret_type (c2m_ctx, ret_type, qword_types);
  if (n_qwords != 0) {
    assert (res.mir_op.mode == MIR_OP_MEM);
    for (i = 0; i < n_qwords; i++) {
      type = qword_types[i];
      insn = MIR_new_insn (ctx, tp_mov (type),
                           MIR_new_mem_op (ctx, type, res.mir_op.u.mem.disp + 8 * i,
                                           res.mir_op.u.mem.base, res.mir_op.u.mem.index,
                                           res.mir_op.u.mem.scale),
                           VARR_GET (MIR_op_t, call_ops, i + call_ops_start + 2));
      MIR_append_insn (ctx, curr_func, insn);
    }
  }
  return res;
}